

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithExpr.cpp
# Opt level: O1

TypeDescriptor * __thiscall CallExpr::evaluate(CallExpr *this,SymTab *symTab)

{
  bool bVar1;
  CallStatement *this_00;
  Token local_98;
  
  this_00 = (CallStatement *)operator_new(0xe0);
  CallStatement::CallStatement(this_00);
  ExprNode::token(&local_98,&this->super_ExprNode);
  bVar1 = CallStatement::callFinder(this_00,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._string._M_dataplus._M_p != &local_98._string.field_2) {
    operator_delete(local_98._string._M_dataplus._M_p,
                    local_98._string.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._relOp._M_dataplus._M_p != &local_98._relOp.field_2) {
    operator_delete(local_98._relOp._M_dataplus._M_p,
                    local_98._relOp.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._name._M_dataplus._M_p != &local_98._name.field_2) {
    operator_delete(local_98._name._M_dataplus._M_p,local_98._name.field_2._M_allocated_capacity + 1
                   );
  }
  if (bVar1) {
    (*(this_00->super_Function).super_Statement._vptr_Statement[1])(this_00,symTab);
  }
  return (TypeDescriptor *)0x0;
}

Assistant:

TypeDescriptor *CallExpr::evaluate(SymTab &symTab) {
    auto *funcFinder = new CallStatement;
    if(funcFinder->callFinder(token()))
        funcFinder->evaluate(symTab);
    return nullptr;
}